

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::emitCurve(SemanticParser *this,SP *shape)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  bool bVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  byte bVar12;
  byte bVar13;
  element_type *peVar14;
  element_type *peVar15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  float fVar16;
  SP SVar17;
  string basis;
  string type;
  SP ours;
  shared_ptr<pbrt::Curve> *in_stack_fffffffffffffbc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  shared_ptr<pbrt::Shape> *this_00;
  undefined4 in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  ParamSet *in_stack_fffffffffffffbe0;
  shared_ptr<pbrt::Material> *in_stack_fffffffffffffbf8;
  string *in_stack_fffffffffffffc00;
  string *name;
  undefined4 in_stack_fffffffffffffc08;
  float in_stack_fffffffffffffc0c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  SemanticParser *in_stack_fffffffffffffc28;
  string *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc50;
  SemanticParser *this_01;
  float in_stack_fffffffffffffc6c;
  string *in_stack_fffffffffffffc70;
  ParamSet *in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffca8;
  int fallBack;
  string *in_stack_fffffffffffffcb0;
  undefined7 in_stack_fffffffffffffcb8;
  undefined5 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd5;
  undefined1 in_stack_fffffffffffffcd6;
  undefined1 in_stack_fffffffffffffcd7;
  ParamSet *in_stack_fffffffffffffcd8;
  undefined1 local_2c1 [80];
  allocator<char> local_271;
  string local_270 [39];
  undefined1 local_249 [40];
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [39];
  undefined1 local_1d1 [40];
  allocator<char> local_1a9;
  string local_1a8 [39];
  undefined1 local_181 [40];
  allocator<char> local_159;
  string local_158 [35];
  byte local_135;
  allocator<char> local_134;
  byte local_133;
  byte local_132;
  undefined1 local_131 [40];
  allocator<char> local_109;
  string local_108 [32];
  string local_e8 [35];
  byte local_c5;
  undefined1 local_c4 [4];
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [32];
  string local_78 [120];
  
  fallBack = (int)((ulong)in_stack_fffffffffffffca8 >> 0x20);
  std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x193a5a);
  std::shared_ptr<pbrt::syntactic::Material>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Material> *)in_stack_fffffffffffffbd0,
             (shared_ptr<pbrt::syntactic::Material> *)in_stack_fffffffffffffbc8);
  findOrCreateMaterial
            (in_stack_fffffffffffffc28,
             (SP *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
  std::make_shared<pbrt::Curve,std::shared_ptr<pbrt::Material>>(in_stack_fffffffffffffbf8);
  std::shared_ptr<pbrt::Material>::~shared_ptr((shared_ptr<pbrt::Material> *)0x193ab9);
  std::shared_ptr<pbrt::syntactic::Material>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Material> *)0x193ac6);
  peVar14 = std::
            __shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x193ad3);
  peVar15 = std::__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x193ae8);
  fVar7 = (peVar14->transform).atStart.l.vx.x;
  fVar8 = (peVar14->transform).atStart.l.vx.y;
  uVar1 = *(undefined8 *)&(peVar14->transform).atStart.l.vx.z;
  fVar3 = (peVar14->transform).atStart.l.vy.y;
  fVar4 = (peVar14->transform).atStart.l.vy.z;
  fVar5 = (peVar14->transform).atStart.l.vz.x;
  fVar6 = (peVar14->transform).atStart.l.vz.y;
  fVar16 = (peVar14->transform).atStart.p.y;
  fVar2 = (peVar14->transform).atStart.p.z;
  *(undefined8 *)&(peVar15->transform).l.vz.z = *(undefined8 *)&(peVar14->transform).atStart.l.vz.z;
  (peVar15->transform).p.y = fVar16;
  (peVar15->transform).p.z = fVar2;
  (peVar15->transform).l.vy.y = fVar3;
  (peVar15->transform).l.vy.z = fVar4;
  (peVar15->transform).l.vz.x = fVar5;
  (peVar15->transform).l.vz.y = fVar6;
  (peVar15->transform).l.vx.x = fVar7;
  (peVar15->transform).l.vx.y = fVar8;
  *(undefined8 *)&(peVar15->transform).l.vx.z = uVar1;
  std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x193b21);
  std::allocator<char>::allocator();
  local_c4[2] = 0;
  local_c4[1] = 0;
  local_c5 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,
             (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
             (allocator<char> *)in_stack_fffffffffffffc00);
  bVar9 = syntactic::ParamSet::hasParamString
                    (in_stack_fffffffffffffbe0,
                     (string *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  if (bVar9) {
    std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x193bb0);
    std::allocator<char>::allocator();
    local_c4[2] = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,
               (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (allocator<char> *)in_stack_fffffffffffffc00);
    local_c4[1] = 1;
    syntactic::ParamSet::getParamString
              (in_stack_fffffffffffffcd8,
               (string *)
               CONCAT17(in_stack_fffffffffffffcd7,
                        CONCAT16(in_stack_fffffffffffffcd6,
                                 CONCAT15(in_stack_fffffffffffffcd5,in_stack_fffffffffffffcd0))));
  }
  else {
    in_stack_fffffffffffffcd8 = (ParamSet *)local_c4;
    std::allocator<char>::allocator();
    local_c5 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,
               (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (allocator<char> *)in_stack_fffffffffffffc00);
  }
  if ((local_c5 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_c4);
  }
  if ((local_c4[1] & 1) != 0) {
    std::__cxx11::string::~string(local_c0);
  }
  if ((local_c4[2] & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(local_c4 + 3));
  }
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  uVar10 = std::operator==(in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
  if ((bool)uVar10) {
    peVar15 = std::__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x193cfc);
    peVar15->type = CurveType_Cylinder;
  }
  else {
    in_stack_fffffffffffffcd6 =
         std::operator==(in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
    if ((bool)in_stack_fffffffffffffcd6) {
      peVar15 = std::__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x193e83);
      peVar15->type = CurveType_Ribbon;
    }
    else {
      in_stack_fffffffffffffcd5 =
           std::operator==(in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
      if ((bool)in_stack_fffffffffffffcd5) {
        peVar15 = std::__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x193ec3);
        peVar15->type = CurveType_Flat;
      }
      else {
        peVar15 = std::__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x193ed9);
        peVar15->type = CurveType_Unknown;
      }
    }
  }
  std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x193ef1);
  std::allocator<char>::allocator();
  local_132 = 0;
  local_133 = 0;
  local_135 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,
             (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
             (allocator<char> *)in_stack_fffffffffffffc00);
  uVar11 = syntactic::ParamSet::hasParamString
                     (in_stack_fffffffffffffbe0,
                      (string *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  if ((bool)uVar11) {
    peVar14 = std::
              __shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x193f80);
    fallBack = (int)((ulong)&(peVar14->super_Node).super_ParamSet >> 0x20);
    in_stack_fffffffffffffcb0 = (string *)local_131;
    std::allocator<char>::allocator();
    local_132 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,
               (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (allocator<char> *)in_stack_fffffffffffffc00);
    local_133 = 1;
    syntactic::ParamSet::getParamString
              (in_stack_fffffffffffffcd8,
               (string *)
               CONCAT17(uVar10,CONCAT16(in_stack_fffffffffffffcd6,
                                        CONCAT15(in_stack_fffffffffffffcd5,in_stack_fffffffffffffcd0
                                                ))));
  }
  else {
    std::allocator<char>::allocator();
    local_135 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,
               (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (allocator<char> *)in_stack_fffffffffffffc00);
  }
  if ((local_135 & 1) != 0) {
    std::allocator<char>::~allocator(&local_134);
  }
  if ((local_133 & 1) != 0) {
    std::__cxx11::string::~string((string *)(local_131 + 1));
  }
  if ((local_132 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_131);
  }
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  bVar9 = std::operator==(in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
  if (bVar9) {
    peVar15 = std::__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1940cc);
    peVar15->basis = CurveBasis_Bezier;
  }
  else {
    bVar9 = std::operator==(in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
    if (bVar9) {
      peVar15 = std::__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x19420a);
      peVar15->basis = CurveBasis_BSpline;
    }
    else {
      peVar15 = std::__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x194220);
      peVar15->basis = CurveBasis_Unknown;
    }
  }
  std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x194236);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,
             (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
             (allocator<char> *)in_stack_fffffffffffffc00);
  bVar9 = syntactic::ParamSet::hasParam1f
                    ((ParamSet *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                     in_stack_fffffffffffffc00);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  if (bVar9) {
    peVar14 = std::
              __shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1942ca);
    in_stack_fffffffffffffc70 = (string *)&(peVar14->super_Node).super_ParamSet;
    in_stack_fffffffffffffc78 = (ParamSet *)local_181;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,
               (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (allocator<char> *)in_stack_fffffffffffffc00);
    in_stack_fffffffffffffc6c =
         syntactic::ParamSet::getParam1f
                   (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
    peVar15 = std::__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x194339);
    peVar15->width1 = in_stack_fffffffffffffc6c;
    peVar15 = std::__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x194357);
    peVar15->width0 = in_stack_fffffffffffffc6c;
    std::__cxx11::string::~string((string *)(local_181 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_181);
  }
  peVar14 = std::
            __shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x194426);
  this_01 = (SemanticParser *)&(peVar14->super_Node).super_ParamSet;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,
             (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
             (allocator<char> *)in_stack_fffffffffffffc00);
  bVar12 = syntactic::ParamSet::hasParam1f
                     ((ParamSet *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                      in_stack_fffffffffffffc00);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  if ((bVar12 & 1) != 0) {
    std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1944ba);
    in_stack_fffffffffffffc48 = (string *)local_1d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,
               (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (allocator<char> *)in_stack_fffffffffffffc00);
    fVar16 = syntactic::ParamSet::getParam1f
                       (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                        in_stack_fffffffffffffc6c);
    peVar15 = std::__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x194520);
    peVar15->width0 = fVar16;
    std::__cxx11::string::~string((string *)(local_1d1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1d1);
  }
  std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1945ec);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,
             (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
             (allocator<char> *)in_stack_fffffffffffffc00);
  bVar13 = syntactic::ParamSet::hasParam1f
                     ((ParamSet *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                      in_stack_fffffffffffffc00);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  if ((bVar13 & 1) != 0) {
    peVar14 = std::
              __shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x19466e);
    in_stack_fffffffffffffc10 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(peVar14->super_Node).super_ParamSet;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,
               (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (allocator<char> *)in_stack_fffffffffffffc00);
    in_stack_fffffffffffffc0c =
         syntactic::ParamSet::getParam1f
                   (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
    peVar15 = std::__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1946ce);
    peVar15->width1 = in_stack_fffffffffffffc0c;
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator(&local_221);
  }
  std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x19479a);
  name = (string *)local_249;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,
             (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
             (allocator<char> *)name);
  bVar9 = syntactic::ParamSet::hasParam1i
                    ((ParamSet *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),name)
  ;
  std::__cxx11::string::~string((string *)(local_249 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_249);
  if (bVar9) {
    peVar14 = std::
              __shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x19481c);
    in_stack_fffffffffffffbe0 = &(peVar14->super_Node).super_ParamSet;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,
               (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (allocator<char> *)name);
    in_stack_fffffffffffffbdc =
         syntactic::ParamSet::getParam1i
                   ((ParamSet *)CONCAT17(uVar11,in_stack_fffffffffffffcb8),in_stack_fffffffffffffcb0
                    ,fallBack);
    in_stack_fffffffffffffbd8 =
         CONCAT13((char)in_stack_fffffffffffffbdc,(int3)in_stack_fffffffffffffbd8);
    peVar15 = std::__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x194881);
    peVar15->degree = (uint8_t)((uint)in_stack_fffffffffffffbd8 >> 0x18);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator(&local_271);
  }
  std::shared_ptr<pbrt::syntactic::Shape>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)in_stack_fffffffffffffbd0,
             (shared_ptr<pbrt::syntactic::Shape> *)in_stack_fffffffffffffbc8);
  this_00 = (shared_ptr<pbrt::Shape> *)local_2c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,
             (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
             (allocator<char> *)name);
  extractVector<pbrt::math::vec3f>
            (this_01,(SP *)CONCAT17(bVar12,in_stack_fffffffffffffc50),in_stack_fffffffffffffc48);
  std::__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1949b2)
  ;
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator=
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
             in_stack_fffffffffffffbe0,
             (vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::~vector
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
             in_stack_fffffffffffffbe0);
  std::__cxx11::string::~string((string *)(local_2c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2c1);
  std::shared_ptr<pbrt::syntactic::Shape>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)0x1949fd);
  std::shared_ptr<pbrt::Shape>::shared_ptr<pbrt::Curve,void>(this_00,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_78);
  std::shared_ptr<pbrt::Curve>::~shared_ptr((shared_ptr<pbrt::Curve> *)0x194a39);
  SVar17.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar17.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar17.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitCurve(pbrt::syntactic::Shape::SP shape)
  {
    Curve::SP ours = std::make_shared<Curve>(findOrCreateMaterial(shape->material));
    ours->transform = shape->transform.atStart;
    // -------------------------------------------------------
    // check 'type'
    // -------------------------------------------------------
    const std::string type
      = shape->hasParamString("type")
      ? shape->getParamString("type")
      : std::string("");
    if (type == "cylinder")
      ours->type = Curve::CurveType_Cylinder;
    else if (type == "ribbon")
      ours->type = Curve::CurveType_Ribbon;
    else if (type == "flat")
      ours->type = Curve::CurveType_Flat;
    else 
      ours->type = Curve::CurveType_Unknown;
        
    // -------------------------------------------------------
    // check 'basis'
    // -------------------------------------------------------
    const std::string basis
      = shape->hasParamString("basis")
      ? shape->getParamString("basis")
      : std::string("");
    if (basis == "bezier")
      ours->basis = Curve::CurveBasis_Bezier;
    else if (basis == "bspline")
      ours->basis = Curve::CurveBasis_BSpline;
    else 
      ours->basis = Curve::CurveBasis_Unknown;
        
    // -------------------------------------------------------
    // check 'width', 'width0', 'width1'
    // -------------------------------------------------------
    if (shape->hasParam1f("width")) 
      ours->width0 = ours->width1 = shape->getParam1f("width");
        
    if (shape->hasParam1f("width0")) 
      ours->width0 = shape->getParam1f("width0");
    if (shape->hasParam1f("width1")) 
      ours->width1 = shape->getParam1f("width1");

    if (shape->hasParam1i("degree")) 
      ours->degree = shape->getParam1i("degree");

    // -------------------------------------------------------
    // vertices - param "P", 3x float each
    // -------------------------------------------------------
    ours->P = extractVector<vec3f>(shape,"P");
    return ours;
  }